

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

bool absl::anon_unknown_0::IsSurrogate(char32_t c,string_view src,Nullable<std::string_*> error)

{
  string_view pc;
  string *in_RCX;
  char *in_RDX;
  size_t in_RSI;
  uint in_EDI;
  AlphaNum *in_stack_00000030;
  AlphaNum *in_stack_00000038;
  Nullable<const_char_*> in_stack_ffffffffffffff48;
  AlphaNum *in_stack_ffffffffffffff50;
  AlphaNum local_a8 [2];
  string local_48 [32];
  string *local_28;
  size_t local_18;
  char *local_10;
  bool local_1;
  
  if ((in_EDI < 0xd800) || (0xdfff < in_EDI)) {
    local_1 = false;
  }
  else {
    if (in_RCX != (string *)0x0) {
      local_28 = in_RCX;
      local_18 = in_RSI;
      local_10 = in_RDX;
      AlphaNum::AlphaNum(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      pc._M_str = local_10;
      pc._M_len = local_18;
      AlphaNum::AlphaNum(local_a8,pc);
      StrCat_abi_cxx11_(in_stack_00000038,in_stack_00000030);
      std::__cxx11::string::operator=(local_28,local_48);
      std::__cxx11::string::~string(local_48);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool IsSurrogate(char32_t c, absl::string_view src,
                        absl::Nullable<std::string*> error) {
  if (c >= 0xD800 && c <= 0xDFFF) {
    if (error) {
      *error = absl::StrCat("invalid surrogate character (0xD800-DFFF): \\",
                            src);
    }
    return true;
  }
  return false;
}